

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtSimplify(word *t,int *pLits,int nVarsAll,int *pnVars)

{
  int iVar1;
  int iVar2;
  word wVar3;
  word wVar4;
  word t1_1;
  word t0_1;
  word t1;
  word t0;
  int u;
  int v;
  int *pnVars_local;
  int nVarsAll_local;
  int *pLits_local;
  word *t_local;
  
  for (t0._4_4_ = 0; t0._4_4_ < nVarsAll; t0._4_4_ = t0._4_4_ + 1) {
    if (pLits[t0._4_4_] == 0) {
      iVar1 = Abc_TtWordNum(nVarsAll);
      Abc_TtCofactor0(t,iVar1,t0._4_4_);
    }
    else if (pLits[t0._4_4_] == 1) {
      iVar1 = Abc_TtWordNum(nVarsAll);
      Abc_TtCofactor1(t,iVar1,t0._4_4_);
    }
  }
  t0._4_4_ = 0;
  do {
    t0._0_4_ = t0._4_4_;
    if (nVarsAll <= t0._4_4_) {
      iVar1 = Abc_TtMinimumBase(t,pLits,nVarsAll,pnVars);
      return iVar1;
    }
    while (t0._0_4_ = (int)t0 + 1, (int)t0 < nVarsAll) {
      iVar1 = Abc_Lit2Var(pLits[t0._4_4_]);
      iVar2 = Abc_Lit2Var(pLits[(int)t0]);
      if (iVar1 == iVar2) {
        if (6 < nVarsAll) {
          __assert_fail("nVarsAll <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x70a,"int Abc_TtSimplify(word *, int *, int, int *)");
        }
        if (pLits[t0._4_4_] == pLits[(int)t0]) {
          wVar3 = Abc_Tt6Cofactor0(*t,t0._4_4_);
          wVar3 = Abc_Tt6Cofactor0(wVar3,(int)t0);
          wVar4 = Abc_Tt6Cofactor1(*t,t0._4_4_);
          wVar4 = Abc_Tt6Cofactor1(wVar4,(int)t0);
          *t = wVar3 & s_Truths6Neg[t0._4_4_] | wVar4 & s_Truths6[t0._4_4_];
        }
        else {
          wVar3 = Abc_Tt6Cofactor0(*t,t0._4_4_);
          wVar3 = Abc_Tt6Cofactor1(wVar3,(int)t0);
          wVar4 = Abc_Tt6Cofactor1(*t,t0._4_4_);
          wVar4 = Abc_Tt6Cofactor0(wVar4,(int)t0);
          *t = wVar3 & s_Truths6Neg[t0._4_4_] | wVar4 & s_Truths6[t0._4_4_];
        }
      }
    }
    t0._4_4_ = t0._4_4_ + 1;
  } while( true );
}

Assistant:

static inline int Abc_TtSimplify( word * t, int * pLits, int nVarsAll, int * pnVars )
{
    int v, u;
    for ( v = 0; v < nVarsAll; v++ )
    {
        if ( pLits[v] == 0 )
            Abc_TtCofactor0( t, Abc_TtWordNum(nVarsAll), v );
        else if ( pLits[v] == 1 )
            Abc_TtCofactor1( t, Abc_TtWordNum(nVarsAll), v );
    }
    for ( v = 0;   v < nVarsAll; v++ )
    for ( u = v+1; u < nVarsAll; u++ )
        if ( Abc_Lit2Var(pLits[v]) == Abc_Lit2Var(pLits[u]) )
        {
            assert( nVarsAll <= 6 );
            if ( pLits[v] == pLits[u] )
            {
                word t0 = Abc_Tt6Cofactor0(Abc_Tt6Cofactor0(*t, v), u);
                word t1 = Abc_Tt6Cofactor1(Abc_Tt6Cofactor1(*t, v), u);
                *t = (t0 & s_Truths6Neg[v]) | (t1 & s_Truths6[v]);
            }
            else // if ( pLits[v] == Abc_LitNot(pLits[u]) )
            {
                word t0 = Abc_Tt6Cofactor1(Abc_Tt6Cofactor0(*t, v), u);
                word t1 = Abc_Tt6Cofactor0(Abc_Tt6Cofactor1(*t, v), u);
                *t = (t0 & s_Truths6Neg[v]) | (t1 & s_Truths6[v]);
            }
        }
    return Abc_TtMinimumBase( t, pLits, nVarsAll, pnVars );
}